

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_SHAPECHANGE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  effect *effect;
  player_upkeep *ppVar2;
  player *p;
  ulong in_RAX;
  player_shape *ppVar3;
  player_shape *ppVar4;
  source sVar5;
  source origin;
  ulong uStack_28;
  _Bool ident;
  
  uStack_28 = in_RAX;
  ppVar3 = player_shape_by_idx(context->subtype);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  if (ppVar3 != (player_shape *)0x0) {
    ppVar4 = lookup_player_shape(ppVar3->name);
    player->shape = ppVar4;
    msg("You assume the shape of a %s!",ppVar3->name);
    msg("Your gear merges into your body.");
    effect = ppVar3->effect;
    if (effect != (effect *)0x0) {
      sVar5 = source_player();
      origin.which = sVar5.which;
      origin._4_4_ = 0;
      origin.what = sVar5.what;
      effect_do(effect,origin,(object *)0x0,&ident,true,L'\0',L'\0',L'\0',(command *)0x0);
    }
    shape_learn_on_assume(player,ppVar3->name);
    p = player;
    ppVar2 = player->upkeep;
    puVar1 = &ppVar2->update;
    *puVar1 = *puVar1 | 1;
    puVar1 = &ppVar2->redraw;
    *(byte *)puVar1 = (byte)*puVar1 | 3;
    handle_stuff(p);
    return true;
  }
  __assert_fail("shape",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                ,0xe15,"_Bool effect_handler_SHAPECHANGE(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_SHAPECHANGE(effect_handler_context_t *context)
{
	struct player_shape *shape = player_shape_by_idx(context->subtype);
	bool ident = false;

	assert(shape);

	/* Change shape */
	player->shape = lookup_player_shape(shape->name);
	msg("You assume the shape of a %s!", shape->name);
	msg("Your gear merges into your body.");

	/* Do effect */
	if (shape->effect) {
		(void) effect_do(shape->effect, source_player(), NULL, &ident, true,
						 0, 0, 0, NULL);
	}

	/* Update */
	shape_learn_on_assume(player, shape->name);
	player->upkeep->update |= (PU_BONUS);
	player->upkeep->redraw |= (PR_TITLE | PR_MISC);
	handle_stuff(player);

	return true;
}